

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolve.cpp
# Opt level: O2

bool __thiscall
DNSResolve::EncodeDotStr(DNSResolve *this,char *dot_str,char *encoded_str,size_t encoded_str_size)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  char *__s;
  long lVar3;
  
  sVar2 = strlen(dot_str);
  bVar1 = sVar2 + 2 <= encoded_str_size;
  if (bVar1 && (encoded_str != (char *)0x0 && dot_str != (char *)0x0)) {
    __dest = (char *)operator_new__(sVar2 + 1);
    strcpy(__dest,dot_str);
    __s = strtok(__dest,".");
    lVar3 = 0;
    while (__s != (char *)0x0) {
      sVar2 = strlen(__s);
      if (sVar2 != 0) {
        sprintf(encoded_str + lVar3,"%c%s",sVar2 & 0xffffffff,__s);
        lVar3 = lVar3 + sVar2 + 1;
      }
      __s = strtok((char *)0x0,".");
    }
    operator_delete(__dest);
  }
  return bVar1 && (encoded_str != (char *)0x0 && dot_str != (char *)0x0);
}

Assistant:

bool DNSResolve::EncodeDotStr(const char* dot_str, char *encoded_str, size_t encoded_str_size)
{
    size_t dot_str_len = strlen(dot_str);

    if (dot_str == NULL || encoded_str == NULL || encoded_str_size < dot_str_len + 2)
    {
        return false;
    }

    char *dot_str_copy = new char[dot_str_len + 1];
    strcpy(dot_str_copy, dot_str);

    char *label = strtok(dot_str_copy, ".");
    size_t label_len = 0;
    size_t encoded_str_len = 0;
    while (label != NULL)
    {
        if ((label_len = strlen(label)) != 0)
        {
            sprintf(encoded_str + encoded_str_len, "%c%s", (int)label_len, label);
            encoded_str_len += (label_len + 1);
        }
        label = strtok(NULL, ".");
    }
    delete dot_str_copy;
    return true;
}